

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4f39de::CallExpr::printLeft(CallExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  Node::print(this->Callee,S);
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  NodeArray::printWithComma(&this->Args,S);
  R_00.Last = "";
  R_00.First = ")";
  OutputStream::operator+=(S,R_00);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Callee->print(S);
    S += "(";
    Args.printWithComma(S);
    S += ")";
  }